

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void benchmark::RunSpecifiedBenchmarks(BenchmarkReporter *reporter)

{
  bool bVar1;
  ulong uVar2;
  unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
  local_50;
  unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
  local_48;
  unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
  default_reporter;
  undefined1 local_30 [8];
  string spec;
  BenchmarkReporter *reporter_local;
  
  spec.field_2._8_8_ = reporter;
  if (FLAGS_benchmark_list_tests) {
    internal::anon_unknown_4::PrintBenchmarkList();
  }
  else {
    std::__cxx11::string::string((string *)local_30,(string *)&FLAGS_benchmark_filter_abi_cxx11_);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) != 0) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"all"), bVar1)) {
      std::__cxx11::string::operator=((string *)local_30,".");
    }
    std::unique_ptr<benchmark::BenchmarkReporter,std::default_delete<benchmark::BenchmarkReporter>>
    ::unique_ptr<std::default_delete<benchmark::BenchmarkReporter>,void>
              ((unique_ptr<benchmark::BenchmarkReporter,std::default_delete<benchmark::BenchmarkReporter>>
                *)&local_48);
    if (spec.field_2._8_8_ == 0) {
      internal::anon_unknown_4::GetDefaultReporter();
      std::
      unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>::
      operator=(&local_48,&local_50);
      std::
      unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>::
      ~unique_ptr(&local_50);
      spec.field_2._8_8_ =
           std::
           unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
           ::get(&local_48);
    }
    internal::anon_unknown_4::RunMatchingBenchmarks
              ((string *)local_30,(BenchmarkReporter *)spec.field_2._8_8_);
    (**(code **)(*(long *)spec.field_2._8_8_ + 0x10))();
    std::
    unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>::
    ~unique_ptr(&local_48);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void RunSpecifiedBenchmarks(BenchmarkReporter* reporter) {
  if (FLAGS_benchmark_list_tests) {
    internal::PrintBenchmarkList();
    return;
  }
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::unique_ptr<BenchmarkReporter> default_reporter;
  if (!reporter) {
    default_reporter = internal::GetDefaultReporter();
    reporter = default_reporter.get();
  }
  internal::RunMatchingBenchmarks(spec, reporter);
  reporter->Finalize();
}